

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::SetAccessors
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,Var getter,Var setter,
          PropertyOperationFlags flags)

{
  int *piVar1;
  BOOL BVar2;
  DictionaryTypeHandlerBase<int> *this_00;
  
  this_00 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
            ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                      ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this,
                       instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  BVar2 = DictionaryTypeHandlerBase<int>::SetAccessors
                    (this_00,instance,propertyId,getter,setter,flags);
  return BVar2;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        return ConvertToDictionaryType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
    }